

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

void list_insert_after(list *list,list_elem *after,list_elem *e)

{
  list_elem *e_local;
  list_elem *after_local;
  list *list_local;
  
  e->next = after->next;
  e->prev = after;
  if (after->next == (list_elem *)0x0) {
    list->tail = e;
  }
  else {
    after->next->prev = e;
  }
  after->next = e;
  return;
}

Assistant:

void list_insert_after(struct list *list, struct list_elem *after, struct list_elem *e)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    e->next = after->next;
    e->prev = after;
    if (after->next) after->next->prev = e;
    else list->tail = e;
    after->next = e;
    IFDEF_LOCK( spin_unlock(&list->lock); );
}